

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

size_t __thiscall
ContextSpecificHolder<Boolean,_(unsigned_char)'\xa5',_(OptionType)0>::EncodedSize
          (ContextSpecificHolder<Boolean,_(unsigned_char)__xa5_,_(OptionType)0> *this)

{
  size_t sVar1;
  
  if ((this->innerType).super_DerBase.cbData != 0) {
    sVar1 = DerBase::EncodedSize((DerBase *)this);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t EncodedSize() 
	{
		if (innerType.GetcbData() == 0)
			return 0;

		return innerType.EncodedSize(); 
	}